

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.cpp
# Opt level: O3

uint duckdb_zstd::XXH32_digest(XXH32_state_t *state_in)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  uint uVar6;
  byte *pbVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  long lVar14;
  undefined8 uVar4;
  
  if (state_in->large_len == 0) {
    iVar11 = state_in->v3 + 0x165667b1;
  }
  else {
    uVar1 = state_in->v1;
    uVar2 = state_in->v2;
    uVar3 = state_in->v3;
    uVar5 = state_in->v4;
    uVar4 = CONCAT44(uVar5,uVar3);
    lVar12 = (uVar4 & 0xffffffff) * 0x1000;
    auVar13._8_4_ = 0x40000;
    auVar13._0_8_ = 0x8000000080;
    auVar13._12_4_ = 0x40000;
    lVar14 = (auVar13._8_8_ & 0xffffffff) * (ulong)(uint)uVar5;
    iVar11 = ((uint)lVar14 | (uint)((ulong)lVar14 >> 0x20)) +
             ((uint)((ulong)(uint)uVar2 * 0x80) | (uint)((ulong)(uint)uVar2 * 0x80 >> 0x20)) +
             ((uint)lVar12 | (uint)((ulong)lVar12 >> 0x20)) +
             ((uint)((ulong)(uint)uVar1 * 2) | (uint)((ulong)(uint)uVar1 * 2 >> 0x20));
  }
  puVar8 = state_in->mem32;
  pbVar7 = (byte *)((long)state_in->mem32 + (ulong)state_in->memsize);
  uVar6 = iVar11 + state_in->total_len_32;
  puVar9 = puVar8;
  if (3 < state_in->memsize) {
    do {
      uVar6 = *puVar9 * -0x3d4d51c3 + uVar6;
      uVar6 = (uVar6 * 0x20000 | uVar6 >> 0xf) * 0x27d4eb2f;
      puVar8 = puVar9 + 1;
      puVar10 = puVar9 + 2;
      puVar9 = puVar8;
    } while (puVar10 <= pbVar7);
  }
  for (; puVar8 < pbVar7; puVar8 = (uint *)((long)puVar8 + 1)) {
    uVar6 = (uint)(byte)*puVar8 * 0x165667b1 + uVar6;
    uVar6 = (uVar6 * 0x800 | uVar6 >> 0x15) * -0x61c8864f;
  }
  uVar6 = (uVar6 >> 0xf ^ uVar6) * -0x7a143589;
  uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51c3;
  return uVar6 >> 0x10 ^ uVar6;
}

Assistant:

XXHASH_FORCE_INLINE_TEMPLATE U32 XXH32_digest_endian (const XXH32_state_t* state, XXH_endianess endian)
{
    const BYTE * p = (const BYTE*)state->mem32;
    const BYTE* const bEnd = (const BYTE*)(state->mem32) + state->memsize;
    U32 h32;

    if (state->large_len) {
        h32 = XXH_rotl32(state->v1, 1) + XXH_rotl32(state->v2, 7) + XXH_rotl32(state->v3, 12) + XXH_rotl32(state->v4, 18);
    } else {
        h32 = state->v3 /* == seed */ + PRIME32_5;
    }

    h32 += state->total_len_32;

    while (p+4<=bEnd) {
        h32 += XXH_readLE32(p, endian) * PRIME32_3;
        h32  = XXH_rotl32(h32, 17) * PRIME32_4;
        p+=4;
    }

    while (p<bEnd) {
        h32 += (*p) * PRIME32_5;
        h32  = XXH_rotl32(h32, 11) * PRIME32_1;
        p++;
    }

    h32 ^= h32 >> 15;
    h32 *= PRIME32_2;
    h32 ^= h32 >> 13;
    h32 *= PRIME32_3;
    h32 ^= h32 >> 16;

    return h32;
}